

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  FILE *pFVar2;
  char *pcVar3;
  FILE *pFVar4;
  int iVar5;
  FILE *pFVar6;
  char *pcVar7;
  size_t sVar8;
  ushort **ppuVar9;
  char cVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  char buffer [4096];
  char *local_1058;
  char *pcStack_1050;
  telnet_t *local_1048;
  FILE *local_1040;
  int local_1038 [1026];
  
  local_1058 = (char *)0x0;
  pcStack_1050 = (char *)0x0;
  if (argc == 3) {
    pFVar6 = fopen(argv[2],"rt");
    if (pFVar6 == (FILE *)0x0) {
      main_cold_4();
      iVar5 = 2;
    }
    else {
      pcVar7 = fgets((char *)local_1038,0x1000,pFVar6);
      if (pcVar7 != (char *)0x0) {
        do {
          local_1058 = append(local_1058,(char *)local_1038);
          pcVar7 = fgets((char *)local_1038,0x1000,pFVar6);
        } while (pcVar7 != (char *)0x0);
      }
      fclose(pFVar6);
      pFVar6 = fopen(argv[1],"rt");
      if (pFVar6 == (FILE *)0x0) {
        main_cold_3();
        iVar5 = 3;
      }
      else {
        local_1048 = telnet_init(telopts,event_print,'\0',&local_1058);
        if (local_1048 == (telnet_t *)0x0) {
          main_cold_2();
          iVar5 = 4;
        }
        else {
          pcVar7 = fgets((char *)local_1038,0x1000,pFVar6);
          pFVar4 = pFVar6;
          pFVar2 = local_1040;
          while ((local_1040 = pFVar4, pcVar7 != (char *)0x0 && (local_1038[0] != 0xa2525))) {
            if ((char)local_1038[0] != '#') {
              sVar8 = strlen((char *)local_1038);
              piVar11 = local_1038;
              if (sVar8 != 0) {
                piVar12 = (int *)((long)local_1038 + sVar8);
                piVar14 = local_1038;
                do {
                  cVar10 = (char)*piVar14;
                  if ((long)cVar10 == 0x25) {
                    piVar13 = (int *)((long)piVar14 + 1);
                    if (piVar13 == piVar12) break;
                    cVar1 = *(char *)piVar13;
                    cVar10 = '%';
                    if ((long)cVar1 != 0x25) {
                      piVar13 = (int *)((long)piVar14 + 2);
                      if (piVar13 == piVar12) break;
                      ppuVar9 = __ctype_b_loc();
                      cVar10 = -0x30;
                      if ((*(byte *)((long)*ppuVar9 + (long)*(char *)piVar13 * 2 + 1) & 8) == 0) {
                        cVar10 = -0x37;
                      }
                      cVar10 = cVar10 + *(char *)piVar13 +
                               (((*(byte *)((long)*ppuVar9 + (long)cVar1 * 2 + 1) & 8) == 0) * '\t'
                               + cVar1) * '\x10';
                    }
LAB_001014db:
                    *(char *)piVar11 = cVar10;
                    piVar11 = (int *)((long)piVar11 + 1);
                    piVar14 = piVar13;
                  }
                  else {
                    ppuVar9 = __ctype_b_loc();
                    piVar13 = piVar14;
                    if ((*(byte *)((long)*ppuVar9 + (long)cVar10 * 2 + 1) & 0x40) != 0)
                    goto LAB_001014db;
                  }
                  piVar14 = (int *)((long)piVar14 + 1);
                } while (piVar14 != piVar12);
              }
              *(char *)piVar11 = '\0';
              telnet_recv(local_1048,(char *)local_1038,(long)piVar11 - (long)local_1038);
              pFVar6 = local_1040;
            }
            pcVar7 = fgets((char *)local_1038,0x1000,pFVar6);
            pFVar4 = local_1040;
            pFVar2 = local_1040;
          }
          local_1040 = pFVar2;
          fclose(pFVar6);
          pcVar3 = pcStack_1050;
          pcVar7 = local_1058;
          iVar5 = strcmp(pcStack_1050,local_1058);
          if (iVar5 == 0) {
            telnet_free(local_1048);
            free(local_1058);
            free(pcStack_1050);
            iVar5 = 0;
          }
          else {
            fprintf(_stderr,"Expected:\n%s\n\nActual:\n%s\n",pcVar7,pcVar3);
            iVar5 = 5;
          }
        }
      }
    }
  }
  else {
    main_cold_1();
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
	FILE *fh;
	telnet_t *telnet;
	char buffer[4096];
	size_t len;
	state_t state;

	state.expected = NULL;
	state.actual = NULL;

	/* check for a requested input file */
	if (argc != 3) {
		fprintf(stderr, "Usage: telnet-test [test file] [expected outline]\n");
		return 1;
	}

	/* load expected input file */
	if ((fh = fopen(argv[2], "rt")) == NULL) {
		fprintf(stderr, "Failed to open %s: %s\n",
				argv[2], strerror(errno));
		return 2;
	}

	while (fgets(buffer, sizeof(buffer), fh) != NULL) {
		state.expected = append(state.expected, buffer);
	}

	fclose(fh);

	/* open input file file */
	if ((fh = fopen(argv[1], "rt")) == NULL) {
		fprintf(stderr, "Failed to open %s: %s\n",
				argv[1], strerror(errno));
		return 3;
	}

	/* create telnet parser instance */
	if ((telnet = telnet_init(telopts, event_print, 0,
			&state)) == 0) {
		fprintf(stderr, "Failed to initialize libtelnet: %s\n",
				strerror(errno));
		fclose(fh);
		return 4;
	}

	/* read input until we hit EOF or marker */
	while (fgets(buffer, sizeof(buffer), fh) != NULL && strcmp(buffer, "%%\n") != 0) {
		if (buffer[0] != '#') {
			len = strlen(buffer);
			decode(buffer, &len);
			telnet_recv(telnet, buffer, len);
		}
	}

	fclose(fh);

	/* compare expected and actual output */
	if (strcmp(state.actual, state.expected) != 0) {
		fprintf(stderr, "Expected:\n%s\n\nActual:\n%s\n", state.expected, state.actual);
		return 5;
	}

	/* clean up */
	telnet_free(telnet);
	free(state.expected);
	free(state.actual);

	return 0;
}